

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O2

void CESkyCoord::ICRS2Ecliptic(CESkyCoord *in_icrs,CESkyCoord *out_ecliptic,CEDate *date)

{
  double dVar1;
  CEAngle CVar2;
  double elat;
  double elon;
  double tt2;
  double tt1;
  double local_f8;
  double local_f0;
  CEAngle local_e8;
  double local_d8;
  double local_d0;
  double local_c8;
  CEAngle local_c0;
  CEDate local_b0;
  CEDate local_70;
  double local_30;
  double local_28;
  
  local_f0 = 0.0;
  local_f8 = 0.0;
  local_28 = 0.0;
  local_30 = 0.0;
  (*date->_vptr_CEDate[5])(date);
  CEDate::UTC2TT((double *)&local_70,&local_28,&local_30);
  local_c8 = local_28;
  local_d0 = local_30;
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_70,dVar1,JD);
  (*in_icrs->_vptr_CESkyCoord[3])(&local_e8,in_icrs,&local_70);
  local_d8 = CEAngle::Rad(&local_e8);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_b0,dVar1,JD);
  (*in_icrs->_vptr_CESkyCoord[4])(&local_c0,in_icrs,&local_b0);
  dVar1 = CEAngle::Rad(&local_c0);
  iauEqec06(local_c8,local_d0,local_d8,SUB84(dVar1,0),&local_f0,&local_f8);
  CEAngle::~CEAngle(&local_c0);
  CEDate::~CEDate(&local_b0);
  CEAngle::~CEAngle(&local_e8);
  CEDate::~CEDate(&local_70);
  CEAngle::Rad((CEAngle *)&local_70,&local_f0);
  CVar2 = CEAngle::Rad((CEAngle *)&local_b0,&local_f8);
  local_e8._vptr_CEAngle._0_4_ = 4;
  (*out_ecliptic->_vptr_CESkyCoord[5])(CVar2.angle_,out_ecliptic,&local_70,&local_b0);
  CEAngle::~CEAngle((CEAngle *)&local_b0);
  CEAngle::~CEAngle((CEAngle *)&local_70);
  return;
}

Assistant:

void CESkyCoord::ICRS2Ecliptic(const CESkyCoord& in_icrs,
                               CESkyCoord*       out_ecliptic,
                               const CEDate&     date)
{
    // Use the sofa method to convert the coordinates
    double elon(0.0);
    double elat(0.0);

    // Get the time in TT
    double tt1(0.0);
    double tt2(0.0);
    CEDate::UTC2TT(date.MJD(), &tt1, &tt2);

    // Convert ICRS -> ECLIPTIC
    iauEqec06(tt1, tt2, in_icrs.XCoord().Rad(), in_icrs.YCoord().Rad(), 
              &elon, &elat);
    out_ecliptic->SetCoordinates(CEAngle::Rad(elon), 
                                 CEAngle::Rad(elat),
                                 CESkyCoordType::ECLIPTIC);

    return;
}